

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ali_ess_remove_instances.cc
# Opt level: O2

int __thiscall
aliyun::Ess::RemoveInstances
          (Ess *this,EssRemoveInstancesRequestType *req,EssRemoveInstancesResponseType *response,
          EssErrorInfo *error_info)

{
  bool bVar1;
  int iVar2;
  AliRpcRequest *this_00;
  Value *pVVar3;
  char *pcVar4;
  allocator<char> local_921;
  string local_920;
  allocator<char> local_8fb;
  allocator<char> local_8fa;
  allocator<char> local_8f9;
  Value val;
  string str_response;
  string local_8c0;
  string local_8a0;
  string local_880;
  string local_860;
  string local_840;
  string local_820;
  string local_800;
  string local_7e0;
  string local_7c0;
  string local_7a0;
  string local_780;
  string local_760;
  string local_740;
  string local_720;
  string local_700;
  string local_6e0;
  string local_6c0;
  string local_6a0;
  string local_680;
  string local_660;
  string local_640;
  string local_620;
  string local_600;
  string local_5e0;
  string local_5c0;
  string local_5a0;
  string local_580;
  string local_560;
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  string local_4c0;
  string local_4a0;
  string local_480;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  string local_300;
  string local_2e0;
  string local_2c0;
  string local_2a0;
  string local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string secheme;
  Reader reader;
  
  str_response._M_dataplus._M_p = (pointer)&str_response.field_2;
  str_response._M_string_length = 0;
  str_response.field_2._M_local_buf[0] = '\0';
  pcVar4 = "http";
  if (this->use_tls_ != false) {
    pcVar4 = "https";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&secheme,pcVar4,(allocator<char> *)&reader);
  this_00 = (AliRpcRequest *)operator_new(0x2c8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,this->version_,(allocator<char> *)&local_920);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a0,this->appid_,(allocator<char> *)&val);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1c0,this->secret_,&local_921);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 &secheme,"://");
  std::operator+(&local_1e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                 this->host_);
  AliRpcRequest::AliRpcRequest(this_00,&local_180,&local_1a0,&local_1c0,&local_1e0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&reader);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_180);
  if (((this->use_tls_ == false) && (pcVar4 = this->proxy_host_, pcVar4 != (char *)0x0)) &&
     (*pcVar4 != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_200,pcVar4,(allocator<char> *)&reader);
    AliHttpRequest::SetHttpProxy((AliHttpRequest *)this_00,&local_200);
    std::__cxx11::string::~string((string *)&local_200);
  }
  Json::Value::Value(&val,nullValue);
  Json::Reader::Reader(&reader);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_220,"Action",(allocator<char> *)&local_920);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_240,"RemoveInstances",&local_921);
  AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_220,&local_240);
  std::__cxx11::string::~string((string *)&local_240);
  std::__cxx11::string::~string((string *)&local_220);
  if ((req->owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_260,"OwnerId",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_280,(string *)req);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_260,&local_280);
    std::__cxx11::string::~string((string *)&local_280);
    std::__cxx11::string::~string((string *)&local_260);
  }
  if ((req->resource_owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2a0,"ResourceOwnerAccount",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_2c0,(string *)&req->resource_owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2a0,&local_2c0);
    std::__cxx11::string::~string((string *)&local_2c0);
    std::__cxx11::string::~string((string *)&local_2a0);
  }
  if ((req->resource_owner_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_2e0,"ResourceOwnerId",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_300,(string *)&req->resource_owner_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_2e0,&local_300);
    std::__cxx11::string::~string((string *)&local_300);
    std::__cxx11::string::~string((string *)&local_2e0);
  }
  if ((req->scaling_group_id)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_320,"ScalingGroupId",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_340,(string *)&req->scaling_group_id);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_320,&local_340);
    std::__cxx11::string::~string((string *)&local_340);
    std::__cxx11::string::~string((string *)&local_320);
  }
  if ((req->instance_id1)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_360,"InstanceId.1",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_380,(string *)&req->instance_id1);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_360,&local_380);
    std::__cxx11::string::~string((string *)&local_380);
    std::__cxx11::string::~string((string *)&local_360);
  }
  if ((req->instance_id2)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3a0,"InstanceId.2",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_3c0,(string *)&req->instance_id2);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3a0,&local_3c0);
    std::__cxx11::string::~string((string *)&local_3c0);
    std::__cxx11::string::~string((string *)&local_3a0);
  }
  if ((req->instance_id3)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3e0,"InstanceId.3",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_400,(string *)&req->instance_id3);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_3e0,&local_400);
    std::__cxx11::string::~string((string *)&local_400);
    std::__cxx11::string::~string((string *)&local_3e0);
  }
  if ((req->instance_id4)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_420,"InstanceId.4",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_440,(string *)&req->instance_id4);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_420,&local_440);
    std::__cxx11::string::~string((string *)&local_440);
    std::__cxx11::string::~string((string *)&local_420);
  }
  if ((req->instance_id5)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_460,"InstanceId.5",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_480,(string *)&req->instance_id5);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_460,&local_480);
    std::__cxx11::string::~string((string *)&local_480);
    std::__cxx11::string::~string((string *)&local_460);
  }
  if ((req->instance_id6)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,"InstanceId.6",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_4c0,(string *)&req->instance_id6);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4a0,&local_4c0);
    std::__cxx11::string::~string((string *)&local_4c0);
    std::__cxx11::string::~string((string *)&local_4a0);
  }
  if ((req->instance_id7)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4e0,"InstanceId.7",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_500,(string *)&req->instance_id7);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_4e0,&local_500);
    std::__cxx11::string::~string((string *)&local_500);
    std::__cxx11::string::~string((string *)&local_4e0);
  }
  if ((req->instance_id8)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_520,"InstanceId.8",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_540,(string *)&req->instance_id8);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_520,&local_540);
    std::__cxx11::string::~string((string *)&local_540);
    std::__cxx11::string::~string((string *)&local_520);
  }
  if ((req->instance_id9)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_560,"InstanceId.9",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_580,(string *)&req->instance_id9);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_560,&local_580);
    std::__cxx11::string::~string((string *)&local_580);
    std::__cxx11::string::~string((string *)&local_560);
  }
  if ((req->instance_id10)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5a0,"InstanceId.10",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_5c0,(string *)&req->instance_id10);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5a0,&local_5c0);
    std::__cxx11::string::~string((string *)&local_5c0);
    std::__cxx11::string::~string((string *)&local_5a0);
  }
  if ((req->instance_id11)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_5e0,"InstanceId.11",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_600,(string *)&req->instance_id11);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_5e0,&local_600);
    std::__cxx11::string::~string((string *)&local_600);
    std::__cxx11::string::~string((string *)&local_5e0);
  }
  if ((req->instance_id12)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_620,"InstanceId.12",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_640,(string *)&req->instance_id12);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_620,&local_640);
    std::__cxx11::string::~string((string *)&local_640);
    std::__cxx11::string::~string((string *)&local_620);
  }
  if ((req->instance_id13)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_660,"InstanceId.13",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_680,(string *)&req->instance_id13);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_660,&local_680);
    std::__cxx11::string::~string((string *)&local_680);
    std::__cxx11::string::~string((string *)&local_660);
  }
  if ((req->instance_id14)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a0,"InstanceId.14",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_6c0,(string *)&req->instance_id14);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6a0,&local_6c0);
    std::__cxx11::string::~string((string *)&local_6c0);
    std::__cxx11::string::~string((string *)&local_6a0);
  }
  if ((req->instance_id15)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6e0,"InstanceId.15",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_700,(string *)&req->instance_id15);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_6e0,&local_700);
    std::__cxx11::string::~string((string *)&local_700);
    std::__cxx11::string::~string((string *)&local_6e0);
  }
  if ((req->instance_id16)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_720,"InstanceId.16",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_740,(string *)&req->instance_id16);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_720,&local_740);
    std::__cxx11::string::~string((string *)&local_740);
    std::__cxx11::string::~string((string *)&local_720);
  }
  if ((req->instance_id17)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_760,"InstanceId.17",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_780,(string *)&req->instance_id17);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_760,&local_780);
    std::__cxx11::string::~string((string *)&local_780);
    std::__cxx11::string::~string((string *)&local_760);
  }
  if ((req->instance_id18)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7a0,"InstanceId.18",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_7c0,(string *)&req->instance_id18);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7a0,&local_7c0);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_7a0);
  }
  if ((req->instance_id19)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7e0,"InstanceId.19",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_800,(string *)&req->instance_id19);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_7e0,&local_800);
    std::__cxx11::string::~string((string *)&local_800);
    std::__cxx11::string::~string((string *)&local_7e0);
  }
  if ((req->instance_id20)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_820,"InstanceId.20",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_840,(string *)&req->instance_id20);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_820,&local_840);
    std::__cxx11::string::~string((string *)&local_840);
    std::__cxx11::string::~string((string *)&local_820);
  }
  if ((req->owner_account)._M_string_length != 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_860,"OwnerAccount",(allocator<char> *)&local_920);
    std::__cxx11::string::string((string *)&local_880,(string *)&req->owner_account);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_860,&local_880);
    std::__cxx11::string::~string((string *)&local_880);
    std::__cxx11::string::~string((string *)&local_860);
  }
  if ((this->region_id_ != (char *)0x0) && (*this->region_id_ != '\0')) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8a0,"RegionId",(allocator<char> *)&local_920);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_8c0,this->region_id_,&local_921);
    AliHttpRequest::AddRequestQuery((AliHttpRequest *)this_00,&local_8a0,&local_8c0);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::__cxx11::string::~string((string *)&local_8a0);
  }
  iVar2 = (**(this_00->super_AliHttpRequest)._vptr_AliHttpRequest)(this_00);
  if (iVar2 == 0) {
    iVar2 = AliHttpRequest::WaitResponseHeaderComplete((AliHttpRequest *)this_00);
    AliHttpRequest::ReadResponseBody((AliHttpRequest *)this_00,&str_response);
    if (((0 < iVar2) && (str_response._M_string_length != 0)) &&
       (bVar1 = Json::Reader::parse(&reader,&str_response,&val,true), bVar1)) {
      if (error_info != (EssErrorInfo *)0x0 && iVar2 != 200) {
        bVar1 = Json::Value::isMember(&val,"RequestId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"RequestId");
          Json::Value::asString_abi_cxx11_(&local_920,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,anon_var_dwarf_10f6e6 + 9,&local_921);
        }
        std::__cxx11::string::operator=((string *)error_info,(string *)&local_920);
        std::__cxx11::string::~string((string *)&local_920);
        bVar1 = Json::Value::isMember(&val,"Code");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Code");
          Json::Value::asString_abi_cxx11_(&local_920,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,anon_var_dwarf_10f6e6 + 9,&local_8f9);
        }
        std::__cxx11::string::operator=((string *)&error_info->code,(string *)&local_920);
        std::__cxx11::string::~string((string *)&local_920);
        bVar1 = Json::Value::isMember(&val,"HostId");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"HostId");
          Json::Value::asString_abi_cxx11_(&local_920,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,anon_var_dwarf_10f6e6 + 9,&local_8fa);
        }
        std::__cxx11::string::operator=((string *)&error_info->host_id,(string *)&local_920);
        std::__cxx11::string::~string((string *)&local_920);
        bVar1 = Json::Value::isMember(&val,"Message");
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"Message");
          Json::Value::asString_abi_cxx11_(&local_920,pVVar3);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_920,anon_var_dwarf_10f6e6 + 9,&local_8fb);
        }
        std::__cxx11::string::operator=((string *)&error_info->message,(string *)&local_920);
        std::__cxx11::string::~string((string *)&local_920);
      }
      if (response != (EssRemoveInstancesResponseType *)0x0 && iVar2 == 200) {
        bVar1 = Json::Value::isMember(&val,"ScalingActivityId");
        iVar2 = 200;
        if (bVar1) {
          pVVar3 = Json::Value::operator[](&val,"ScalingActivityId");
          Json::Value::asString_abi_cxx11_(&local_920,pVVar3);
          std::__cxx11::string::operator=((string *)response,(string *)&local_920);
          std::__cxx11::string::~string((string *)&local_920);
        }
      }
      goto LAB_0014a0e2;
    }
  }
  iVar2 = -1;
  if (error_info != (EssErrorInfo *)0x0) {
    std::__cxx11::string::assign((char *)&error_info->code);
  }
LAB_0014a0e2:
  AliRpcRequest::~AliRpcRequest(this_00);
  operator_delete(this_00,0x2c8);
  Json::Reader::~Reader(&reader);
  Json::Value::~Value(&val);
  std::__cxx11::string::~string((string *)&secheme);
  std::__cxx11::string::~string((string *)&str_response);
  return iVar2;
}

Assistant:

int Ess::RemoveInstances(const EssRemoveInstancesRequestType& req,
                      EssRemoveInstancesResponseType* response,
                       EssErrorInfo* error_info) {
  std::string str_response;
  int status_code;
  int ret = 0;
  bool parse_success = false;
  std::string secheme = this->use_tls_ ? "https" : "http";
  AliRpcRequest* req_rpc = new AliRpcRequest(version_,
                         appid_,
                         secret_,
                         secheme + "://" + host_);
  if((!this->use_tls_) && this->proxy_host_ && this->proxy_host_[0]) {
    req_rpc->SetHttpProxy( this->proxy_host_);
  }
  Json::Value val;
  Json::Reader reader;
  req_rpc->AddRequestQuery("Action","RemoveInstances");
  if(!req.owner_id.empty()) {
    req_rpc->AddRequestQuery("OwnerId", req.owner_id);
  }
  if(!req.resource_owner_account.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerAccount", req.resource_owner_account);
  }
  if(!req.resource_owner_id.empty()) {
    req_rpc->AddRequestQuery("ResourceOwnerId", req.resource_owner_id);
  }
  if(!req.scaling_group_id.empty()) {
    req_rpc->AddRequestQuery("ScalingGroupId", req.scaling_group_id);
  }
  if(!req.instance_id1.empty()) {
    req_rpc->AddRequestQuery("InstanceId.1", req.instance_id1);
  }
  if(!req.instance_id2.empty()) {
    req_rpc->AddRequestQuery("InstanceId.2", req.instance_id2);
  }
  if(!req.instance_id3.empty()) {
    req_rpc->AddRequestQuery("InstanceId.3", req.instance_id3);
  }
  if(!req.instance_id4.empty()) {
    req_rpc->AddRequestQuery("InstanceId.4", req.instance_id4);
  }
  if(!req.instance_id5.empty()) {
    req_rpc->AddRequestQuery("InstanceId.5", req.instance_id5);
  }
  if(!req.instance_id6.empty()) {
    req_rpc->AddRequestQuery("InstanceId.6", req.instance_id6);
  }
  if(!req.instance_id7.empty()) {
    req_rpc->AddRequestQuery("InstanceId.7", req.instance_id7);
  }
  if(!req.instance_id8.empty()) {
    req_rpc->AddRequestQuery("InstanceId.8", req.instance_id8);
  }
  if(!req.instance_id9.empty()) {
    req_rpc->AddRequestQuery("InstanceId.9", req.instance_id9);
  }
  if(!req.instance_id10.empty()) {
    req_rpc->AddRequestQuery("InstanceId.10", req.instance_id10);
  }
  if(!req.instance_id11.empty()) {
    req_rpc->AddRequestQuery("InstanceId.11", req.instance_id11);
  }
  if(!req.instance_id12.empty()) {
    req_rpc->AddRequestQuery("InstanceId.12", req.instance_id12);
  }
  if(!req.instance_id13.empty()) {
    req_rpc->AddRequestQuery("InstanceId.13", req.instance_id13);
  }
  if(!req.instance_id14.empty()) {
    req_rpc->AddRequestQuery("InstanceId.14", req.instance_id14);
  }
  if(!req.instance_id15.empty()) {
    req_rpc->AddRequestQuery("InstanceId.15", req.instance_id15);
  }
  if(!req.instance_id16.empty()) {
    req_rpc->AddRequestQuery("InstanceId.16", req.instance_id16);
  }
  if(!req.instance_id17.empty()) {
    req_rpc->AddRequestQuery("InstanceId.17", req.instance_id17);
  }
  if(!req.instance_id18.empty()) {
    req_rpc->AddRequestQuery("InstanceId.18", req.instance_id18);
  }
  if(!req.instance_id19.empty()) {
    req_rpc->AddRequestQuery("InstanceId.19", req.instance_id19);
  }
  if(!req.instance_id20.empty()) {
    req_rpc->AddRequestQuery("InstanceId.20", req.instance_id20);
  }
  if(!req.owner_account.empty()) {
    req_rpc->AddRequestQuery("OwnerAccount", req.owner_account);
  }
  if(this->region_id_ && this->region_id_[0]) {
    req_rpc->AddRequestQuery("RegionId", this->region_id_);
  }
  if(req_rpc->CommitRequest() != 0) {
     if(error_info) {
       error_info->code = "connect to host failed";
     }
     ret = -1;
     goto out;
  }
  status_code = req_rpc->WaitResponseHeaderComplete();
  req_rpc->ReadResponseBody(str_response);
  if(status_code > 0 && !str_response.empty()){
    parse_success = reader.parse(str_response, val);
  }
  if(!parse_success) {
    if(error_info) {
      error_info->code = "parse response failed";
    }
    ret = -1;
    goto out;
  }
  if(status_code!= 200 && error_info && parse_success) {
    error_info->request_id = val.isMember("RequestId") ? val["RequestId"].asString(): "";
    error_info->code = val.isMember("Code") ? val["Code"].asString(): "";
    error_info->host_id = val.isMember("HostId") ? val["HostId"].asString(): "";
    error_info->message = val.isMember("Message") ? val["Message"].asString(): "";
  }
  if(status_code== 200 && response) {
    Json2Type(val, response);
  }
  ret = status_code;
out:
  delete req_rpc;
  return ret;
}